

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_rr_divide(DisasContext_conflict14 *ctx)

{
  TCGContext_conflict9 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  TCGv_i32 pTVar6;
  TCGv_i32 pTVar7;
  TCGv_i32 pTVar8;
  TCGv_i64 pTVar9;
  TCGv_i64 ret_1;
  TCGv_i64 ret;
  TCGv_i32 temp3;
  TCGv_i32 temp2;
  TCGv_i32 temp;
  int r3;
  int r2;
  int r1;
  uint32_t op2;
  TCGContext_conflict9 *tcg_ctx;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = extract32(ctx->opcode,0x14,8);
  uVar2 = extract32(ctx->opcode,0x1c,4);
  uVar3 = extract32(ctx->opcode,0xc,4);
  uVar4 = extract32(ctx->opcode,8,4);
  switch(uVar1) {
  case 0:
    gen_helper_fcmp(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_env,
                    tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
    break;
  case 1:
    gen_helper_bmerge(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_gpr_d[(int)uVar4]
                      ,tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
    break;
  case 2:
    gen_helper_parity(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_gpr_d[(int)uVar4]
                     );
    break;
  case 3:
    iVar5 = has_feature(ctx,3);
    if (iVar5 == 0) {
      generate_trap(ctx,2,1);
    }
    else {
      gen_helper_crc32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],
                       tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
    }
    break;
  case 4:
    gen_helper_fmul(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_env,
                    tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
    break;
  case 5:
    gen_helper_fdiv(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_env,
                    tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
    break;
  default:
    generate_trap(ctx,2,1);
    break;
  case 8:
    if ((uVar2 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    gen_unpack(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_gpr_d[(int)(uVar2 + 1)],
               tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    break;
  case 9:
    if ((uVar2 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    gen_bsplit(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_gpr_d[(int)(uVar2 + 1)],
               tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    break;
  case 10:
    tcg_gen_setcondi_i32_tricore
              (tcg_ctx_00,TCG_COND_EQ,tcg_ctx_00->cpu_PSW_V,tcg_ctx_00->cpu_gpr_d[(int)uVar3],0);
    tcg_gen_shli_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,tcg_ctx_00->cpu_PSW_V,0x1f);
    tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_SV,tcg_ctx_00->cpu_PSW_SV,tcg_ctx_00->cpu_PSW_V);
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_AV,0);
    tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)(uVar2 + 1)],0);
    break;
  case 0xc:
    gen_helper_updfl(tcg_ctx_00,tcg_ctx_00->cpu_env,tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    break;
  case 0x10:
    gen_helper_ftoi(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_env,
                    tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    break;
  case 0x13:
    gen_helper_ftoiz(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_env,
                     tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    break;
  case 0x14:
    gen_helper_itof(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_env,
                    tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    break;
  case 0x16:
    gen_helper_utof(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_env,
                    tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    break;
  case 0x17:
    gen_helper_ftouz(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_env,
                     tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    break;
  case 0x19:
    gen_helper_qseed(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_env,
                     tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    break;
  case 0x1a:
    pTVar6 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    if ((uVar2 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    tcg_gen_setcondi_i32_tricore(tcg_ctx_00,TCG_COND_EQ,pTVar6,tcg_ctx_00->cpu_gpr_d[(int)uVar3],-1)
    ;
    tcg_gen_setcondi_i32_tricore
              (tcg_ctx_00,TCG_COND_EQ,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar4],-0x80000000);
    tcg_gen_and_i32(tcg_ctx_00,pTVar6,pTVar6,pTVar7);
    tcg_gen_setcondi_i32_tricore(tcg_ctx_00,TCG_COND_EQ,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar3],0);
    tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,pTVar6,pTVar7);
    tcg_gen_shli_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,tcg_ctx_00->cpu_PSW_V,0x1f);
    tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_SV,tcg_ctx_00->cpu_PSW_SV,tcg_ctx_00->cpu_PSW_V);
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_AV,0);
    tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_gpr_d[(int)uVar4]);
    tcg_gen_sari_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)(uVar2 + 1)],tcg_ctx_00->cpu_gpr_d[(int)uVar4],
               0x1f);
    tcg_temp_free_i32(tcg_ctx_00,pTVar6);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    break;
  case 0x20:
    iVar5 = has_feature(ctx,2);
    if (iVar5 == 0) {
      generate_trap(ctx,2,1);
    }
    else {
      pTVar9 = tcg_temp_new_i64(tcg_ctx_00);
      gen_helper_divide(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_env,tcg_ctx_00->cpu_gpr_d[(int)uVar4],
                        tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
      tcg_gen_extr_i64_i32_tricore
                (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],
                 tcg_ctx_00->cpu_gpr_d[(int)(uVar2 + 1)],pTVar9);
      tcg_temp_free_i64(tcg_ctx_00,pTVar9);
    }
    break;
  case 0x21:
    iVar5 = has_feature(ctx,2);
    if (iVar5 == 0) {
      generate_trap(ctx,2,1);
    }
    else {
      pTVar9 = tcg_temp_new_i64(tcg_ctx_00);
      gen_helper_divide_u(tcg_ctx_00,pTVar9,tcg_ctx_00->cpu_env,tcg_ctx_00->cpu_gpr_d[(int)uVar4],
                          tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
      tcg_gen_extr_i64_i32_tricore
                (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],
                 tcg_ctx_00->cpu_gpr_d[(int)(uVar2 + 1)],pTVar9);
      tcg_temp_free_i64(tcg_ctx_00,pTVar9);
    }
    break;
  case 0x2a:
    pTVar6 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    if ((uVar2 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    tcg_gen_shri_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar4],0x10);
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_AV,0);
    iVar5 = has_feature(ctx,1);
    if (iVar5 == 0) {
      tcg_gen_abs_i32_tricore(tcg_ctx_00,pTVar6,pTVar8);
      tcg_gen_abs_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
      tcg_gen_setcond_i32_tricore(tcg_ctx_00,TCG_COND_GE,tcg_ctx_00->cpu_PSW_V,pTVar6,pTVar7);
    }
    else {
      tcg_gen_setcondi_i32_tricore
                (tcg_ctx_00,TCG_COND_EQ,tcg_ctx_00->cpu_PSW_V,tcg_ctx_00->cpu_gpr_d[(int)uVar3],0);
    }
    tcg_gen_shli_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,tcg_ctx_00->cpu_PSW_V,0x1f);
    tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_SV,tcg_ctx_00->cpu_PSW_SV,tcg_ctx_00->cpu_PSW_V);
    tcg_gen_shli_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_gpr_d[(int)uVar4],0x10);
    tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)(uVar2 + 1)],pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar6);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    break;
  case 0x3a:
    if ((uVar2 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    gen_dvinit_h(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_gpr_d[(int)(uVar2 + 1)],
                 tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
    break;
  case 0x4a:
    pTVar6 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    if ((uVar2 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    tcg_gen_shri_i32_tricore(tcg_ctx_00,pTVar8,tcg_ctx_00->cpu_gpr_d[(int)uVar4],8);
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_AV,0);
    iVar5 = has_feature(ctx,1);
    if (iVar5 == 0) {
      tcg_gen_abs_i32_tricore(tcg_ctx_00,pTVar6,pTVar8);
      tcg_gen_abs_i32_tricore(tcg_ctx_00,pTVar7,tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
      tcg_gen_setcond_i32_tricore(tcg_ctx_00,TCG_COND_GE,tcg_ctx_00->cpu_PSW_V,pTVar6,pTVar7);
    }
    else {
      tcg_gen_setcondi_i32_tricore
                (tcg_ctx_00,TCG_COND_EQ,tcg_ctx_00->cpu_PSW_V,tcg_ctx_00->cpu_gpr_d[(int)uVar3],0);
    }
    tcg_gen_shli_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_PSW_V,tcg_ctx_00->cpu_PSW_V,0x1f);
    tcg_gen_or_i32(tcg_ctx_00,tcg_ctx_00->cpu_PSW_SV,tcg_ctx_00->cpu_PSW_SV,tcg_ctx_00->cpu_PSW_V);
    tcg_gen_shli_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_gpr_d[(int)uVar4],0x18);
    tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)(uVar2 + 1)],pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar6);
    tcg_temp_free_i32(tcg_ctx_00,pTVar7);
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    break;
  case 0x5a:
    if ((uVar2 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    gen_dvinit_b(ctx,tcg_ctx_00->cpu_gpr_d[(int)uVar2],tcg_ctx_00->cpu_gpr_d[(int)(uVar2 + 1)],
                 tcg_ctx_00->cpu_gpr_d[(int)uVar4],tcg_ctx_00->cpu_gpr_d[(int)uVar3]);
  }
  return;
}

Assistant:

static void decode_rr_divide(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    uint32_t op2;
    int r1, r2, r3;

    TCGv temp, temp2, temp3;

    op2 = MASK_OP_RR_OP2(ctx->opcode);
    r3 = MASK_OP_RR_D(ctx->opcode);
    r2 = MASK_OP_RR_S2(ctx->opcode);
    r1 = MASK_OP_RR_S1(ctx->opcode);

    switch (op2) {
    case OPC2_32_RR_BMERGE:
        gen_helper_bmerge(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_BSPLIT:
        CHECK_REG_PAIR(r3);
        gen_bsplit(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_DVINIT_B:
        CHECK_REG_PAIR(r3);
        gen_dvinit_b(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1],
                     tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_DVINIT_BU:
        temp = tcg_temp_new(tcg_ctx);
        temp2 = tcg_temp_new(tcg_ctx);
        temp3 = tcg_temp_new(tcg_ctx);
        CHECK_REG_PAIR(r3);
        tcg_gen_shri_tl(tcg_ctx, temp3, tcg_ctx->cpu_gpr_d[r1], 8);
        /* reset av */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, 0);
        if (!has_feature(ctx, TRICORE_FEATURE_131)) {
            /* overflow = (abs(D[r3+1]) >= abs(D[r2])) */
            tcg_gen_abs_tl(tcg_ctx, temp, temp3);
            tcg_gen_abs_tl(tcg_ctx, temp2, tcg_ctx->cpu_gpr_d[r2]);
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->cpu_PSW_V, temp, temp2);
        } else {
            /* overflow = (D[b] == 0) */
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_gpr_d[r2], 0);
        }
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, 31);
        /* sv */
        tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
        /* write result */
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], 24);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3+1], temp3);

        tcg_temp_free(tcg_ctx, temp);
        tcg_temp_free(tcg_ctx, temp2);
        tcg_temp_free(tcg_ctx, temp3);
        break;
    case OPC2_32_RR_DVINIT_H:
        CHECK_REG_PAIR(r3);
        gen_dvinit_h(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1],
                     tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_DVINIT_HU:
        temp = tcg_temp_new(tcg_ctx);
        temp2 = tcg_temp_new(tcg_ctx);
        temp3 = tcg_temp_new(tcg_ctx);
        CHECK_REG_PAIR(r3);
        tcg_gen_shri_tl(tcg_ctx, temp3, tcg_ctx->cpu_gpr_d[r1], 16);
        /* reset av */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, 0);
        if (!has_feature(ctx, TRICORE_FEATURE_131)) {
            /* overflow = (abs(D[r3+1]) >= abs(D[r2])) */
            tcg_gen_abs_tl(tcg_ctx, temp, temp3);
            tcg_gen_abs_tl(tcg_ctx, temp2, tcg_ctx->cpu_gpr_d[r2]);
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->cpu_PSW_V, temp, temp2);
        } else {
            /* overflow = (D[b] == 0) */
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_gpr_d[r2], 0);
        }
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, 31);
        /* sv */
        tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
        /* write result */
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], 16);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3+1], temp3);
        tcg_temp_free(tcg_ctx, temp);
        tcg_temp_free(tcg_ctx, temp2);
        tcg_temp_free(tcg_ctx, temp3);
        break;
    case OPC2_32_RR_DVINIT:
        temp = tcg_temp_new(tcg_ctx);
        temp2 = tcg_temp_new(tcg_ctx);
        CHECK_REG_PAIR(r3);
        /* overflow = ((D[b] == 0) ||
                      ((D[b] == 0xFFFFFFFF) && (D[a] == 0x80000000))) */
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp, tcg_ctx->cpu_gpr_d[r2], 0xffffffff);
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp2, tcg_ctx->cpu_gpr_d[r1], 0x80000000);
        tcg_gen_and_tl(tcg_ctx, temp, temp, temp2);
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp2, tcg_ctx->cpu_gpr_d[r2], 0);
        tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, temp, temp2);
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, 31);
        /* sv */
        tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
        /* reset av */
       tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, 0);
        /* write result */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1]);
        /* sign extend to high reg */
        tcg_gen_sari_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1], 31);
        tcg_temp_free(tcg_ctx, temp);
        tcg_temp_free(tcg_ctx, temp2);
        break;
    case OPC2_32_RR_DVINIT_U:
        /* overflow = (D[b] == 0) */
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_gpr_d[r2], 0);
        tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, 31);
        /* sv */
        tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
        /* reset av */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, 0);
        /* write result */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1]);
        /* zero extend to high reg*/
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r3+1], 0);
        break;
    case OPC2_32_RR_PARITY:
        gen_helper_parity(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_UNPACK:
        CHECK_REG_PAIR(r3);
        gen_unpack(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_CRC32:
        if (has_feature(ctx, TRICORE_FEATURE_161)) {
            gen_helper_crc32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        } else {
            generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
        }
        break;
    case OPC2_32_RR_DIV:
        if (has_feature(ctx, TRICORE_FEATURE_16)) {
            GEN_HELPER_RR(tcg_ctx, divide, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], tcg_ctx->cpu_gpr_d[r1],
                          tcg_ctx->cpu_gpr_d[r2]);
        } else {
            generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
        }
        break;
    case OPC2_32_RR_DIV_U:
        if (has_feature(ctx, TRICORE_FEATURE_16)) {
            GEN_HELPER_RR(tcg_ctx, divide_u, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1],
                          tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        } else {
            generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
        }
        break;
    case OPC2_32_RR_MUL_F:
        gen_helper_fmul(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_DIV_F:
        gen_helper_fdiv(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_CMP_F:
        gen_helper_fcmp(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2]);
        break;
    case OPC2_32_RR_FTOI:
        gen_helper_ftoi(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_ITOF:
        gen_helper_itof(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_FTOUZ:
        gen_helper_ftouz(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_UPDFL:
        gen_helper_updfl(tcg_ctx, tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_UTOF:
        gen_helper_utof(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_FTOIZ:
        gen_helper_ftoiz(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    case OPC2_32_RR_QSEED_F:
        gen_helper_qseed(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_env, tcg_ctx->cpu_gpr_d[r1]);
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
}